

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O3

TimingControl *
slang::ast::SignalEventControl::fromSyntax
          (Compilation *compilation,BinaryPropertyExprSyntax *syntax,ASTContext *context)

{
  int iVar1;
  int iVar2;
  ExpressionSyntax *pEVar3;
  ExpressionSyntax *pEVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  InvalidTimingControl *pIVar5;
  SourceRange sourceRange;
  TimingControl *local_30;
  
  pEVar3 = ASTContext::requireSimpleExpr(context,(syntax->left).ptr,(DiagCode)0x280008);
  pEVar4 = ASTContext::requireSimpleExpr(context,(syntax->right).ptr,(DiagCode)0x280008);
  if (pEVar3 == (ExpressionSyntax *)0x0 || pEVar4 == (ExpressionSyntax *)0x0) {
    local_30 = (TimingControl *)0x0;
    pIVar5 = BumpAllocator::
             emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
                       (&compilation->super_BumpAllocator,&local_30);
  }
  else {
    iVar1 = Expression::bind((int)pEVar3,(sockaddr *)context,0x24000);
    iVar2 = Expression::bind((int)pEVar4,(sockaddr *)context,0x4000);
    sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    pIVar5 = (InvalidTimingControl *)
             fromExpr(compilation,None,(Expression *)CONCAT44(extraout_var,iVar1),
                      (Expression *)CONCAT44(extraout_var_00,iVar2),context,sourceRange);
  }
  return &pIVar5->super_TimingControl;
}

Assistant:

TimingControl& SignalEventControl::fromSyntax(Compilation& compilation,
                                              const BinaryPropertyExprSyntax& syntax,
                                              const ASTContext& context) {
    // We can hit this case for 'iff' binary property expressions that are actually
    // just a signal event with an 'iff' clause.
    SLANG_ASSERT(syntax.kind == SyntaxKind::IffPropertyExpr);

    auto left = context.requireSimpleExpr(*syntax.left, diag::InvalidSyntaxInEventExpr);
    auto right = context.requireSimpleExpr(*syntax.right, diag::InvalidSyntaxInEventExpr);
    if (!left || !right)
        return badCtrl(compilation, nullptr);

    auto& expr = Expression::bind(*left, context,
                                  ASTFlags::EventExpression | ASTFlags::AllowClockingBlock);

    auto& iffCond = Expression::bind(*right, context, ASTFlags::EventExpression);

    return fromExpr(compilation, EdgeKind::None, expr, &iffCond, context, syntax.sourceRange());
}